

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v10::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int iVar1;
  size_t sVar2;
  uint in_EAX;
  int iVar3;
  int index;
  size_t sVar4;
  bigit borrow;
  undefined8 uStack_38;
  
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format.h"
                ,0xb00,"unaligned bigints");
  }
  uStack_38._0_4_ = in_EAX;
  iVar3 = compare(this,other);
  if (-1 < iVar3) {
    uStack_38 = (ulong)(uint)uStack_38;
    iVar3 = other->exp_;
    iVar1 = this->exp_;
    sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
    for (sVar4 = 0; index = (int)sVar4 + (iVar3 - iVar1), sVar2 != sVar4; sVar4 = sVar4 + 1) {
      subtract_bigits(this,index,(other->bigits_).super_buffer<unsigned_int>.ptr_[sVar4],
                      (bigit *)((long)&uStack_38 + 4));
    }
    while (uStack_38._4_4_ != 0) {
      subtract_bigits(this,index,0,(bigit *)((long)&uStack_38 + 4));
    }
    remove_leading_zeros(this);
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format.h"
              ,0xb01,anon_var_dwarf_307b52 + 9);
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }